

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::DoCompactionWork(DBImpl *this,CompactionState *compact)

{
  _Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
  *p_Var1;
  _func_int **pp_Var2;
  pointer pOVar3;
  VersionSet *this_00;
  CleanupFunction p_Var4;
  void *pvVar5;
  TableBuilder *this_01;
  __pthread_internal_list *p_Var6;
  bool bVar7;
  _func_int ***ppp_Var8;
  bool bVar9;
  int iVar10;
  Logger *pLVar11;
  Iterator *pIVar12;
  long lVar13;
  long lVar14;
  undefined4 extraout_var;
  undefined8 uVar15;
  uint64_t uVar16;
  undefined4 extraout_var_00;
  _func_int *p_Var17;
  long *plVar18;
  char *pcVar19;
  long lVar20;
  Iterator *in_RDX;
  Env *extraout_RDX;
  Cache *extraout_RDX_00;
  CleanupFunction p_Var21;
  long lVar22;
  uint uVar23;
  pointer *ppOVar24;
  ulong uVar25;
  long lVar26;
  ParsedInternalKey ikey;
  string current_user_key;
  LevelSummaryStorage tmp;
  undefined1 local_118 [64];
  uint local_d8;
  Logger *local_d0;
  uint64_t *local_c8;
  _func_int **local_c0;
  Cache *pCStack_b8;
  undefined1 local_b0 [16];
  char *local_a0;
  Env *local_98;
  undefined8 local_38;
  
  pLVar11 = (Logger *)(**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  pp_Var2 = in_RDX->_vptr_Iterator;
  Log((Logger *)compact[1].smallest_snapshot,"Compacting %d@%d + %d@%d files",
      (ulong)((long)pp_Var2[0x19] - (long)pp_Var2[0x18]) >> 3,(ulong)*(uint *)pp_Var2,
      (ulong)((long)pp_Var2[0x1c] - (long)pp_Var2[0x1b]) >> 3,(ulong)(*(uint *)pp_Var2 + 1));
  iVar10 = VersionSet::NumLevelFiles
                     ((VersionSet *)compact[8].outfile,*(int *)in_RDX->_vptr_Iterator);
  if (iVar10 < 1) {
    __assert_fail("versions_->NumLevelFiles(compact->compaction->level()) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x380,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  if (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0) {
    __assert_fail("compact->builder == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x381,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  local_d0 = pLVar11;
  if (in_RDX[1]._vptr_Iterator != (_func_int **)0x0) {
    __assert_fail("compact->outfile == nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/db_impl.cc"
                  ,0x382,"Status leveldb::DBImpl::DoCompactionWork(CompactionState *)");
  }
  pOVar3 = compact[7].outputs.
           super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (VersionSet *)compact[8].outfile;
  ppOVar24 = (pointer *)&this_00->last_sequence_;
  if (pOVar3 != (pointer)(compact + 7)) {
    ppOVar24 = (pointer *)&(pOVar3->smallest).rep_._M_string_length;
  }
  (in_RDX->cleanup_head_).function = (CleanupFunction)*ppOVar24;
  pIVar12 = VersionSet::MakeInputIterator(this_00,(Compaction *)in_RDX->_vptr_Iterator);
  local_118._32_8_ = &compact[3].smallest_snapshot;
  pthread_mutex_unlock((pthread_mutex_t *)local_118._32_8_);
  (*pIVar12->_vptr_Iterator[3])(pIVar12);
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_118._40_8_ = "";
  local_118._48_8_ = (Comparator *)0x0;
  local_c0 = (_func_int **)local_b0;
  local_118._24_8_ = (Comparator *)0x0;
  pCStack_b8 = (Cache *)0x0;
  local_b0[0] = 0;
  local_c8 = &compact[3].total_bytes;
  p_Var21 = (CleanupFunction)0xffffffffffffff;
  lVar26 = 0;
  local_118._16_8_ = this;
  do {
    iVar10 = (*pIVar12->_vptr_Iterator[2])(pIVar12);
    if (((char)iVar10 == '\0') || (((ulong)compact[3].builder & 1) != 0)) break;
    if (((ulong)compact[5].compaction & 1) != 0) {
      lVar13 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
      iVar10 = pthread_mutex_lock((pthread_mutex_t *)local_118._32_8_);
      if (iVar10 != 0) goto LAB_0010eed2;
      if (compact[4].total_bytes != 0) {
        CompactMemTable((DBImpl *)compact);
        std::condition_variable::notify_all();
      }
      pthread_mutex_unlock((pthread_mutex_t *)local_118._32_8_);
      lVar14 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
      lVar26 = (lVar26 - lVar13) + lVar14;
    }
    iVar10 = (*pIVar12->_vptr_Iterator[8])(pIVar12);
    local_a0 = (char *)CONCAT44(extraout_var,iVar10);
    local_98 = extraout_RDX;
    bVar9 = Compaction::ShouldStopBefore
                      ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)&stack0xffffffffffffff60);
    if ((bVar9) && (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0)) {
      FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
      uVar15 = local_118._0_8_;
      pp_Var2 = *(_func_int ***)local_118._16_8_;
      *(undefined8 *)local_118._16_8_ = local_118._0_8_;
      local_118._0_8_ = pp_Var2;
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      if ((_func_int **)uVar15 == (_func_int **)0x0) goto LAB_0010ea91;
LAB_0010ecad:
      bVar9 = false;
    }
    else {
LAB_0010ea91:
      if (local_98 < (Env *)0x8) {
LAB_0010eb78:
        pCStack_b8 = (Cache *)0x0;
        *(char *)local_c0 = '\0';
        local_118._24_8_ = (Comparator *)0x0;
        bVar9 = false;
        p_Var21 = (CleanupFunction)0xffffffffffffff;
      }
      else {
        local_118._56_8_ =
             ZEXT78(CONCAT16(((code *)((long)local_a0 + -1))[(long)local_98],
                             CONCAT15(((code *)((long)local_a0 + -2))[(long)local_98],
                                      CONCAT14(((code *)((long)local_a0 + -3))[(long)local_98],
                                               *(undefined4 *)
                                                ((code *)((long)local_a0 + -7) + (long)local_98)))))
        ;
        local_118._48_8_ = local_98 + -1;
        local_d8 = (uint)(byte)*(code *)((long)&((FilterPolicy *)((long)local_a0 + -8))->
                                                _vptr_FilterPolicy + (long)local_98);
        local_118._40_8_ = local_a0;
        if (1 < local_d8) goto LAB_0010eb78;
        if ((local_118._24_8_ & 1) == 0) {
LAB_0010eb1d:
          uVar15 = std::__cxx11::string::_M_replace
                             ((ulong)&local_c0,0,(char *)pCStack_b8,local_118._40_8_);
          local_118._24_8_ = CONCAT71((int7)((ulong)uVar15 >> 8),1);
          p_Var21 = (CleanupFunction)0xffffffffffffff;
        }
        else {
          pOVar3 = (compact->outputs).
                   super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          local_118._0_8_ = local_c0;
          local_118._8_8_ = pCStack_b8;
          iVar10 = (**(code **)(pOVar3->number + 0x10))(pOVar3,local_118 + 0x28,local_118);
          if (iVar10 != 0) goto LAB_0010eb1d;
        }
        p_Var4 = (in_RDX->cleanup_head_).function;
        bVar9 = true;
        bVar7 = p_Var4 < p_Var21;
        p_Var21 = (CleanupFunction)local_118._56_8_;
        if (((bVar7) && (bVar9 = false, local_d8 == 0)) && ((ulong)local_118._56_8_ <= p_Var4)) {
          bVar9 = Compaction::IsBaseLevelForKey
                            ((Compaction *)in_RDX->_vptr_Iterator,(Slice *)(local_118 + 0x28));
          p_Var21 = (CleanupFunction)local_118._56_8_;
        }
      }
      if (bVar9 == false) {
        if (in_RDX[1].cleanup_head_.function == (CleanupFunction)0x0) {
          OpenCompactionOutputFile((DBImpl *)local_118,compact);
          uVar15 = local_118._0_8_;
          pp_Var2 = *(_func_int ***)local_118._16_8_;
          *(undefined8 *)local_118._16_8_ = local_118._0_8_;
          local_118._0_8_ = pp_Var2;
          if (pp_Var2 != (_func_int **)0x0) {
            operator_delete__(pp_Var2);
          }
          if ((_func_int **)uVar15 != (_func_int **)0x0) goto LAB_0010ecad;
        }
        uVar16 = TableBuilder::NumEntries((TableBuilder *)in_RDX[1].cleanup_head_.function);
        if (uVar16 == 0) {
          pvVar5 = (in_RDX->cleanup_head_).arg2;
          std::__cxx11::string::_M_replace
                    ((long)pvVar5 - 0x40,0,*(char **)((long)pvVar5 + -0x38),(ulong)local_a0);
        }
        pvVar5 = (in_RDX->cleanup_head_).arg2;
        std::__cxx11::string::_M_replace
                  ((long)pvVar5 - 0x20,0,*(char **)((long)pvVar5 + -0x18),(ulong)local_a0);
        this_01 = (TableBuilder *)in_RDX[1].cleanup_head_.function;
        iVar10 = (*pIVar12->_vptr_Iterator[9])(pIVar12);
        local_118._0_8_ = CONCAT44(extraout_var_00,iVar10);
        local_118._8_8_ = extraout_RDX_00;
        TableBuilder::Add(this_01,(Slice *)&stack0xffffffffffffff60,(Slice *)local_118);
        p_Var17 = (_func_int *)
                  TableBuilder::FileSize((TableBuilder *)in_RDX[1].cleanup_head_.function);
        if (in_RDX->_vptr_Iterator[1] <= p_Var17) {
          FinishCompactionOutputFile((DBImpl *)local_118,compact,in_RDX);
          uVar15 = local_118._0_8_;
          pp_Var2 = *(_func_int ***)local_118._16_8_;
          *(undefined8 *)local_118._16_8_ = local_118._0_8_;
          local_118._0_8_ = pp_Var2;
          if (pp_Var2 != (_func_int **)0x0) {
            operator_delete__(pp_Var2);
          }
          if ((_func_int **)uVar15 != (_func_int **)0x0) goto LAB_0010ecad;
        }
      }
      (*pIVar12->_vptr_Iterator[6])(pIVar12);
      bVar9 = true;
    }
  } while (bVar9);
  uVar15 = local_118._16_8_;
  if ((*(_func_int **)local_118._16_8_ == (_func_int *)0x0) &&
     (((ulong)compact[3].builder & 1) != 0)) {
    local_a0 = "Deleting DB during compaction";
    local_98 = (Env *)0x1d;
    local_118._0_8_ = "";
    local_118._8_8_ = (Cache *)0x0;
    Status::Status((Status *)&stack0xffffffffffffffc8,kIOError,(Slice *)&stack0xffffffffffffff60,
                   (Slice *)local_118);
    p_Var6 = *(__pthread_internal_list **)uVar15;
    *(undefined8 *)uVar15 = local_38;
    local_38 = p_Var6;
    if (p_Var6 != (__pthread_internal_list *)0x0) {
      operator_delete__(p_Var6);
    }
  }
  if ((*(_func_int **)uVar15 == (_func_int *)0x0) &&
     (in_RDX[1].cleanup_head_.function != (CleanupFunction)0x0)) {
    FinishCompactionOutputFile((DBImpl *)&stack0xffffffffffffff60,compact,in_RDX);
    *(char **)uVar15 = local_a0;
  }
  if (*(_func_int **)uVar15 == (_func_int *)0x0) {
    (*pIVar12->_vptr_Iterator[10])(&stack0xffffffffffffff60,pIVar12);
    *(char **)uVar15 = local_a0;
  }
  (*pIVar12->_vptr_Iterator[1])(pIVar12);
  lVar14 = (**(code **)(*(long *)compact->smallest_snapshot + 0xa8))();
  ppp_Var8 = &local_d0->_vptr_Logger;
  lVar22 = 0;
  lVar13 = 0;
  do {
    p_Var17 = in_RDX->_vptr_Iterator[lVar13 * 3 + 0x18];
    uVar23 = (uint)((ulong)((long)in_RDX->_vptr_Iterator[lVar13 * 3 + 0x19] - (long)p_Var17) >> 3);
    if (0 < (int)uVar23) {
      uVar25 = 0;
      do {
        lVar22 = lVar22 + *(long *)(*(long *)(p_Var17 + uVar25 * 8) + 0x10);
        uVar25 = uVar25 + 1;
      } while ((uVar23 & 0x7fffffff) != uVar25);
    }
    bVar9 = lVar13 == 0;
    lVar13 = lVar13 + 1;
  } while (bVar9);
  pvVar5 = (in_RDX->cleanup_head_).arg1;
  lVar13 = (long)(in_RDX->cleanup_head_).arg2 - (long)pvVar5;
  if (lVar13 == 0) {
    lVar13 = 0;
  }
  else {
    lVar20 = (lVar13 >> 4) * -0x3333333333333333;
    lVar20 = lVar20 + (ulong)(lVar20 == 0);
    plVar18 = (long *)((long)pvVar5 + 8);
    lVar13 = 0;
    do {
      lVar13 = lVar13 + *plVar18;
      plVar18 = plVar18 + 10;
      lVar20 = lVar20 + -1;
    } while (lVar20 != 0);
  }
  iVar10 = pthread_mutex_lock((pthread_mutex_t *)local_118._32_8_);
  uVar15 = local_118._16_8_;
  if (iVar10 == 0) {
    iVar10 = *(int *)in_RDX->_vptr_Iterator;
    p_Var1 = &(&compact[9].outputs)[iVar10].
              super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
    ;
    (p_Var1->_M_impl).super__Vector_impl_data._M_start =
         (pointer)((long)(p_Var1->_M_impl).super__Vector_impl_data._M_start +
                  (lVar14 - ((long)ppp_Var8 + lVar26)));
    ppOVar24 = &(&compact[9].outputs)[iVar10].
                super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *ppOVar24 = (pointer)((long)&(*ppOVar24)->number + lVar22);
    ppOVar24 = &(&compact[9].outputs)[iVar10].
                super__Vector_base<leveldb::DBImpl::CompactionState::Output,_std::allocator<leveldb::DBImpl::CompactionState::Output>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage;
    *ppOVar24 = (pointer)((long)&(*ppOVar24)->number + lVar13);
    if (*(_func_int **)local_118._16_8_ == (_func_int *)0x0) {
      InstallCompactionResults((DBImpl *)&stack0xffffffffffffff60,compact);
      *(char **)uVar15 = local_a0;
    }
    if (*(_func_int **)uVar15 != (_func_int *)0x0) {
      RecordBackgroundError((DBImpl *)compact,(Status *)uVar15);
    }
    pLVar11 = (Logger *)compact[1].smallest_snapshot;
    pcVar19 = VersionSet::LevelSummary
                        ((VersionSet *)compact[8].outfile,
                         (LevelSummaryStorage *)&stack0xffffffffffffff60);
    Log(pLVar11,"compacted to: %s",pcVar19);
    if (local_c0 != (_func_int **)local_b0) {
      operator_delete(local_c0);
    }
    return (Status)(char *)uVar15;
  }
LAB_0010eed2:
  std::__throw_system_error(iVar10);
}

Assistant:

Status DBImpl::DoCompactionWork(CompactionState* compact) {
  const uint64_t start_micros = env_->NowMicros();
  int64_t imm_micros = 0;  // Micros spent doing imm_ compactions

  Log(options_.info_log, "Compacting %d@%d + %d@%d files",
      compact->compaction->num_input_files(0), compact->compaction->level(),
      compact->compaction->num_input_files(1),
      compact->compaction->level() + 1);

  assert(versions_->NumLevelFiles(compact->compaction->level()) > 0);
  assert(compact->builder == nullptr);
  assert(compact->outfile == nullptr);
  if (snapshots_.empty()) {
    compact->smallest_snapshot = versions_->LastSequence();
  } else {
    compact->smallest_snapshot = snapshots_.oldest()->sequence_number();
  }

  Iterator* input = versions_->MakeInputIterator(compact->compaction);

  // Release mutex while we're actually doing the compaction work
  mutex_.Unlock();

  input->SeekToFirst();
  Status status;
  ParsedInternalKey ikey;
  std::string current_user_key;
  bool has_current_user_key = false;
  SequenceNumber last_sequence_for_key = kMaxSequenceNumber;
  while (input->Valid() && !shutting_down_.load(std::memory_order_acquire)) {
    // Prioritize immutable compaction work
    if (has_imm_.load(std::memory_order_relaxed)) {
      const uint64_t imm_start = env_->NowMicros();
      mutex_.Lock();
      if (imm_ != nullptr) {
        CompactMemTable();
        // Wake up MakeRoomForWrite() if necessary.
        background_work_finished_signal_.SignalAll();
      }
      mutex_.Unlock();
      imm_micros += (env_->NowMicros() - imm_start);
    }

    Slice key = input->key();
    if (compact->compaction->ShouldStopBefore(key) &&
        compact->builder != nullptr) {
      status = FinishCompactionOutputFile(compact, input);
      if (!status.ok()) {
        break;
      }
    }

    // Handle key/value, add to state, etc.
    bool drop = false;
    if (!ParseInternalKey(key, &ikey)) {
      // Do not hide error keys
      current_user_key.clear();
      has_current_user_key = false;
      last_sequence_for_key = kMaxSequenceNumber;
    } else {
      if (!has_current_user_key ||
          user_comparator()->Compare(ikey.user_key, Slice(current_user_key)) !=
              0) {
        // First occurrence of this user key
        current_user_key.assign(ikey.user_key.data(), ikey.user_key.size());
        has_current_user_key = true;
        last_sequence_for_key = kMaxSequenceNumber;
      }

      if (last_sequence_for_key <= compact->smallest_snapshot) {
        // Hidden by an newer entry for same user key
        drop = true;  // (A)
      } else if (ikey.type == kTypeDeletion &&
                 ikey.sequence <= compact->smallest_snapshot &&
                 compact->compaction->IsBaseLevelForKey(ikey.user_key)) {
        // For this user key:
        // (1) there is no data in higher levels
        // (2) data in lower levels will have larger sequence numbers
        // (3) data in layers that are being compacted here and have
        //     smaller sequence numbers will be dropped in the next
        //     few iterations of this loop (by rule (A) above).
        // Therefore this deletion marker is obsolete and can be dropped.
        drop = true;
      }

      last_sequence_for_key = ikey.sequence;
    }
#if 0
    Log(options_.info_log,
        "  Compact: %s, seq %d, type: %d %d, drop: %d, is_base: %d, "
        "%d smallest_snapshot: %d",
        ikey.user_key.ToString().c_str(),
        (int)ikey.sequence, ikey.type, kTypeValue, drop,
        compact->compaction->IsBaseLevelForKey(ikey.user_key),
        (int)last_sequence_for_key, (int)compact->smallest_snapshot);
#endif

    if (!drop) {
      // Open output file if necessary
      if (compact->builder == nullptr) {
        status = OpenCompactionOutputFile(compact);
        if (!status.ok()) {
          break;
        }
      }
      if (compact->builder->NumEntries() == 0) {
        compact->current_output()->smallest.DecodeFrom(key);
      }
      compact->current_output()->largest.DecodeFrom(key);
      compact->builder->Add(key, input->value());

      // Close output file if it is big enough
      if (compact->builder->FileSize() >=
          compact->compaction->MaxOutputFileSize()) {
        status = FinishCompactionOutputFile(compact, input);
        if (!status.ok()) {
          break;
        }
      }
    }

    input->Next();
  }

  if (status.ok() && shutting_down_.load(std::memory_order_acquire)) {
    status = Status::IOError("Deleting DB during compaction");
  }
  if (status.ok() && compact->builder != nullptr) {
    status = FinishCompactionOutputFile(compact, input);
  }
  if (status.ok()) {
    status = input->status();
  }
  delete input;
  input = nullptr;

  CompactionStats stats;
  stats.micros = env_->NowMicros() - start_micros - imm_micros;
  for (int which = 0; which < 2; which++) {
    for (int i = 0; i < compact->compaction->num_input_files(which); i++) {
      stats.bytes_read += compact->compaction->input(which, i)->file_size;
    }
  }
  for (size_t i = 0; i < compact->outputs.size(); i++) {
    stats.bytes_written += compact->outputs[i].file_size;
  }

  mutex_.Lock();
  stats_[compact->compaction->level() + 1].Add(stats);

  if (status.ok()) {
    status = InstallCompactionResults(compact);
  }
  if (!status.ok()) {
    RecordBackgroundError(status);
  }
  VersionSet::LevelSummaryStorage tmp;
  Log(options_.info_log, "compacted to: %s", versions_->LevelSummary(&tmp));
  return status;
}